

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_clib___newindex(lua_State *L)

{
  ushort uVar1;
  TValue *pTVar2;
  CType *pCVar3;
  TValue *pTVar4;
  CTState *cts;
  
  pTVar4 = ffi_clib_index(L);
  pTVar2 = L->base;
  if ((pTVar2 + 2 < L->top) && ((pTVar4->field_2).it == 0xfffffff5)) {
    cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
    cts->L = L;
    uVar1 = *(ushort *)((ulong)(pTVar4->u32).lo + 6);
    pCVar3 = cts->tab;
    if (((pCVar3[uVar1].info & 0xf0000000) == 0xc0000000) &&
       (uVar1 = (ushort)pCVar3[uVar1].info, (pCVar3[uVar1].info >> 0x19 & 1) == 0)) {
      lj_cconv_ct_tv(cts,pCVar3 + uVar1,*(uint8_t **)((ulong)(pTVar4->u32).lo + 8),pTVar2 + 2,0);
      return 0;
    }
  }
  lj_err_caller(L,LJ_ERR_FFI_WRCONST);
}

Assistant:

LJLIB_CF(ffi_clib___newindex)	LJLIB_REC(clib_index 0)
{
  TValue *tv = ffi_clib_index(L);
  TValue *o = L->base+2;
  if (o < L->top && tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *d = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(d->info)) {
      CTInfo qual = 0;
      for (;;) {  /* Skip attributes and collect qualifiers. */
	d = ctype_child(cts, d);
	if (!ctype_isattrib(d->info)) break;
	if (ctype_attrib(d->info) == CTA_QUAL) qual |= d->size;
      }
      if (!((d->info|qual) & CTF_CONST)) {
	lj_cconv_ct_tv(cts, d, *(void **)cdataptr(cd), o, 0);
	return 0;
      }
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_WRCONST);
  return 0;  /* unreachable */
}